

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::UpdateChunkName(Segment *this,char *ext,char **name)

{
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  char *str;
  size_t length;
  char ext_chk [64];
  char **name_local;
  char *ext_local;
  Segment *this_local;
  
  if ((name == (char **)0x0) || (ext == (char *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    ext_chk._56_8_ = name;
    snprintf((char *)&length,0x40,"_%06d.%s",(ulong)(uint)this->chunk_count_,ext);
    sVar1 = strlen(this->chunking_base_name_);
    sVar2 = strlen((char *)&length);
    __dest = (char *)operator_new__(sVar1 + sVar2 + 1,(nothrow_t *)&std::nothrow);
    if (__dest == (char *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      strcpy(__dest,this->chunking_base_name_);
      strcat(__dest,(char *)&length);
      if (*(void **)ext_chk._56_8_ != (void *)0x0) {
        operator_delete__(*(void **)ext_chk._56_8_);
      }
      *(char **)ext_chk._56_8_ = __dest;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Segment::UpdateChunkName(const char* ext, char** name) const {
  if (!name || !ext)
    return false;

  char ext_chk[64];
#ifdef _MSC_VER
  sprintf_s(ext_chk, sizeof(ext_chk), "_%06d.%s", chunk_count_, ext);
#else
  snprintf(ext_chk, sizeof(ext_chk), "_%06d.%s", chunk_count_, ext);
#endif

  const size_t length = strlen(chunking_base_name_) + strlen(ext_chk) + 1;
  char* const str = new (std::nothrow) char[length];  // NOLINT
  if (!str)
    return false;

#ifdef _MSC_VER
  strcpy_s(str, length - strlen(ext_chk), chunking_base_name_);
  strcat_s(str, length, ext_chk);
#else
  strcpy(str, chunking_base_name_);
  strcat(str, ext_chk);
#endif

  delete[] * name;
  *name = str;

  return true;
}